

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

TypedExpectation<char_*(unsigned_long)> * __thiscall
testing::internal::TypedExpectation<char_*(unsigned_long)>::WillOnce
          (TypedExpectation<char_*(unsigned_long)> *this,Action<char_*(unsigned_long)> *action)

{
  pointer *pppvVar1;
  Clause CVar2;
  uint uVar3;
  char *pcVar4;
  ActionInterface<char_*(unsigned_long)> *pAVar5;
  iterator __position;
  FailureReporterInterface *pFVar6;
  CardinalityInterface *pCVar7;
  CardinalityInterface *this_00;
  linked_ptr<const_testing::CardinalityInterface> local_48;
  CardinalityInterface local_38 [2];
  
  CVar2 = (this->super_ExpectationBase).last_clause_;
  local_48.value_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().","");
  if (5 < (int)CVar2) {
    uVar3 = (this->super_ExpectationBase).line_;
    pcVar4 = (this->super_ExpectationBase).file_;
    pFVar6 = GetFailureReporter();
    (*pFVar6->_vptr_FailureReporterInterface[2])(pFVar6,0,pcVar4,(ulong)uVar3,&local_48);
  }
  if (local_48.value_ != local_38) {
    operator_delete(local_48.value_);
  }
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  pCVar7 = (CardinalityInterface *)operator_new(0x10);
  pAVar5 = (action->impl_).value_;
  pCVar7->_vptr_CardinalityInterface = (_func_int **)pAVar5;
  this_00 = pCVar7 + 1;
  if (pAVar5 == (ActionInterface<char_*(unsigned_long)> *)0x0) {
    this_00->_vptr_CardinalityInterface = (_func_int **)this_00;
  }
  else {
    linked_ptr_internal::join((linked_ptr_internal *)this_00,&(action->impl_).link_);
  }
  __position._M_current =
       (this->super_ExpectationBase).untyped_actions_.
       super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.value_ = pCVar7;
  if (__position._M_current ==
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void_const*,std::allocator<void_const*>>::_M_realloc_insert<void_const*>
              ((vector<void_const*,std::allocator<void_const*>> *)
               &(this->super_ExpectationBase).untyped_actions_,__position,&local_48.value_);
  }
  else {
    *__position._M_current = pCVar7;
    pppvVar1 = &(this->super_ExpectationBase).untyped_actions_.
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    linked_ptr<const_testing::CardinalityInterface>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_,&local_48);
    linked_ptr<const_testing::CardinalityInterface>::~linked_ptr(&local_48);
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }